

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator(cmNinjaNormalTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmOSXBundleGenerator *pcVar2;
  pointer pcVar3;
  
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_005ea028;
  pcVar2 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
  if (pcVar2 != (cmOSXBundleGenerator *)0x0) {
    pcVar3 = (pcVar2->ConfigName)._M_dataplus._M_p;
    paVar1 = &(pcVar2->ConfigName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pcVar2,0x40);
  pcVar3 = (this->DeviceLinkObject)._M_dataplus._M_p;
  paVar1 = &(this->DeviceLinkObject).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetLinkLanguage)._M_dataplus._M_p;
  paVar1 = &(this->TargetLinkLanguage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  cmGeneratorTarget::Names::~Names(&this->TargetNames);
  cmNinjaTargetGenerator::~cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator()
{
  delete this->OSXBundleGenerator;
}